

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O0

value_type_conflict10 *
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::StoreT<long_double>,long_double>
          (longdouble *in)

{
  cx_string<1UL> cVar1;
  value_type_conflict10 *pvVar2;
  string_view tag_00;
  cx_string<1UL> tag;
  InputStream istream;
  StoreT<long_double> visitor;
  OutputStream ostream;
  stringstream stream;
  undefined6 in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffdfe;
  longdouble *in_stack_fffffffffffffe00;
  undefined6 in_stack_fffffffffffffe10;
  StoreT<long_double> local_1c8;
  long *local_1a8;
  StoreT<long_double> *in_stack_fffffffffffffe60;
  long local_190 [50];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_190);
  std::ios::exceptions((int)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  local_1a8 = local_190;
  mserialize::serialize<long_double,OutputStream>
            (in_stack_fffffffffffffe00,
             (OutputStream *)CONCAT26(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8));
  anon_unknown.dwarf_ae198::StoreT<long_double>::StoreT(&local_1c8);
  cVar1 = mserialize::tag<long_double>();
  tag_00 = mserialize::cx_string::operator_cast_to_string_view((cx_string<1UL> *)0x1c8e64);
  mserialize::visit<(anonymous_namespace)::StoreT<long_double>,InputStream>
            (tag_00,(StoreT<long_double> *)CONCAT26(cVar1._data,in_stack_fffffffffffffe10),
             (InputStream *)tag_00._ptr);
  anon_unknown.dwarf_ae198::StoreT<long_double>::value(in_stack_fffffffffffffe60);
  pvVar2 = (value_type_conflict10 *)
           std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  return pvVar2;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}